

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

QFileSystemEntry *
QFileSystemEngine::canonicalName
          (QFileSystemEntry *__return_storage_ptr__,QFileSystemEntry *entry,
          QFileSystemMetaData *data)

{
  byte *pbVar1;
  ulong uVar2;
  Data *pDVar3;
  Data *pDVar4;
  qint16 qVar5;
  bool bVar6;
  void *pvVar7;
  char *data_00;
  int *piVar8;
  long lVar9;
  char *b;
  long in_FS_OFFSET;
  char stack_result [4097];
  NativePath local_1050;
  NativePath local_1038 [171];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = QFileSystemEntry::isEmpty(entry);
  if (bVar6) {
    piVar8 = __errno_location();
    *piVar8 = 0x16;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,entry);
      return __return_storage_ptr__;
    }
  }
  else {
    QFileSystemEntry::nativeFilePath(local_1038,entry);
    if ((local_1038[0].d.size == 0) ||
       (pvVar7 = memchr(local_1038[0].d.ptr,0,local_1038[0].d.size), pvVar7 == (void *)0x0)) {
      lVar9 = -1;
    }
    else {
      lVar9 = (long)pvVar7 - (long)local_1038[0].d.ptr;
    }
    if (&(local_1038[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1038[0].d.d)->super_QArrayData,1,0x10);
      }
    }
    if (lVar9 == -1) {
      memset(local_1038,0xaa,0x1001);
      QFileSystemEntry::nativeFilePath(&local_1050,entry);
      if (local_1050.d.ptr == (char *)0x0) {
        local_1050.d.ptr = "";
      }
      data_00 = realpath(local_1050.d.ptr,(char *)local_1038);
      if (&(local_1050.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1050.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (data_00 == (char *)0x0) {
        piVar8 = __errno_location();
        if ((*piVar8 == 0x14) || (*piVar8 == 2)) {
          pbVar1 = (byte *)((long)&(data->knownFlagsMask).
                                   super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
          *pbVar1 = *pbVar1 | 0x40;
          pbVar1 = (byte *)((long)&(data->entryFlags).
                                   super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
          *pbVar1 = *pbVar1 & 0xbf;
          QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__);
        }
        else {
          pDVar3 = (entry->m_filePath).d.d;
          (__return_storage_ptr__->m_filePath).d.d = pDVar3;
          (__return_storage_ptr__->m_filePath).d.ptr = (entry->m_filePath).d.ptr;
          (__return_storage_ptr__->m_filePath).d.size = (entry->m_filePath).d.size;
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          pDVar4 = (entry->m_nativeFilePath).d.d;
          (__return_storage_ptr__->m_nativeFilePath).d.d = pDVar4;
          (__return_storage_ptr__->m_nativeFilePath).d.ptr = (entry->m_nativeFilePath).d.ptr;
          (__return_storage_ptr__->m_nativeFilePath).d.size = (entry->m_nativeFilePath).d.size;
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          __return_storage_ptr__->m_lastDotInFileName = entry->m_lastDotInFileName;
          qVar5 = entry->m_firstDotInFileName;
          __return_storage_ptr__->m_lastSeparator = entry->m_lastSeparator;
          __return_storage_ptr__->m_firstDotInFileName = qVar5;
        }
      }
      else {
        uVar2._0_4_ = data->knownFlagsMask;
        uVar2._4_4_ = data->entryFlags;
        data->knownFlagsMask = (MetaDataFlags)(int)(uVar2 | 0x40000000400000);
        data->entryFlags = (MetaDataFlags)(int)((uVar2 | 0x40000000400000) >> 0x20);
        QByteArray::QByteArray(&local_1050,data_00,-1);
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,&local_1050);
        if (&(local_1050.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if (((local_1050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_1050.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
    }
    else {
      piVar8 = __errno_location();
      *piVar8 = 0x16;
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,entry);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::canonicalName(const QFileSystemEntry &entry, QFileSystemMetaData &data)
{
    Q_CHECK_FILE_NAME(entry, entry);
    char *resolved_name = nullptr;

#ifdef PATH_MAX
    // use the stack to avoid the overhead of memory allocation
    char stack_result[PATH_MAX + 1];
#else
    // system with unlimited file paths -> must use heap
    std::nullptr_t stack_result = nullptr;
    auto freer = qScopeGuard([&] { free(resolved_name); });
#endif

# if defined(Q_OS_DARWIN) || defined(Q_OS_ANDROID)
    // On some Android and macOS versions, realpath() will return a path even if
    // it does not exist. To work around this, we check existence in advance.
    if (!data.hasFlags(QFileSystemMetaData::ExistsAttribute))
        fillMetaData(entry, data, QFileSystemMetaData::ExistsAttribute);

    if (!data.exists())
        errno = ENOENT;
    else
        resolved_name = realpath(entry.nativeFilePath().constData(), stack_result);
# else
    resolved_name = realpath(entry.nativeFilePath().constData(), stack_result);
# endif
    if (resolved_name) {
        data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        data.entryFlags |= QFileSystemMetaData::ExistsAttribute;
        return QFileSystemEntry(resolved_name, QFileSystemEntry::FromNativePath{});
    } else if (errno == ENOENT || errno == ENOTDIR) { // file doesn't exist
        data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        data.entryFlags &= ~(QFileSystemMetaData::ExistsAttribute);
        return QFileSystemEntry();
    }
    return entry;
}